

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

double __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
::_mat(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_i)

{
  int iVar1;
  StorageIndex *pSVar2;
  StorageIndex *pSVar3;
  StorageIndex *pSVar4;
  const_iterator cVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Scalar SVar11;
  
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_label_to_idx)._M_h,label_i);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  lVar6 = *(long *)((long)cVar5.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x28);
  if ((((-1 < lVar6) && (lVar10 = (this->_quadmat).m_outerSize, 0 < lVar10)) && (lVar6 < lVar10)) &&
     (lVar10 <= (this->_quadmat).m_innerSize)) {
    pSVar2 = (this->_quadmat).m_outerIndex;
    pSVar3 = (this->_quadmat).m_innerNonZeros;
    if (pSVar3 == (StorageIndex *)0x0) {
      iVar7 = pSVar2[lVar6 + 1];
    }
    else {
      iVar7 = pSVar3[lVar6] + pSVar2[lVar6];
    }
    iVar1 = (this->_quadmat).m_outerIndex[lVar6];
    lVar6 = (long)iVar1;
    SVar11 = 0.0;
    if (iVar1 < iVar7) {
      lVar8 = (long)iVar7;
      iVar7 = (int)lVar10 + -1;
      pSVar4 = (this->_quadmat).m_data.m_indices;
      lVar10 = lVar8 + -1;
      if (iVar7 != pSVar4[lVar8 + -1]) {
        while (lVar9 = lVar10, lVar6 < lVar9) {
          lVar10 = lVar9 + lVar6 >> 1;
          if (pSVar4[lVar10] < iVar7) {
            lVar6 = lVar10 + 1;
            lVar10 = lVar9;
          }
        }
        if (lVar8 <= lVar6) {
          return 0.0;
        }
        lVar10 = lVar6;
        if (iVar7 != pSVar4[lVar6]) {
          return 0.0;
        }
      }
      SVar11 = (this->_quadmat).m_data.m_values[lVar10];
    }
    return SVar11;
  }
  __assert_fail("row>=0 && row<rows() && col>=0 && col<cols()",
                "/usr/include/eigen3/Eigen/src/SparseCore/SparseMatrix.h",0xc0,
                "Scalar Eigen::SparseMatrix<double, 1>::coeff(Index, Index) const [_Scalar = double, _Options = 1, _StorageIndex = int]"
               );
}

Assistant:

inline FloatType _mat( IndexType label_i ) const {
      size_t i = _label_to_idx.at( label_i );
      return _quadmat_get( i, _quadmat.rows() - 1 );
    }